

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O2

cupdlp_retcode PDHG_Power_Method(CUPDLPwork *work,cupdlp_float *lambda)

{
  CUPDLPdata *pCVar1;
  CUPDLPiterates *pCVar2;
  CUPDLPvec *ax;
  CUPDLPvec *aty;
  cupdlp_float *x;
  cupdlp_float *res_00;
  int iVar3;
  uint uVar4;
  cupdlp_float qNorm;
  double res;
  cupdlp_float *local_48;
  cupdlp_float *local_40;
  cupdlp_float alpha;
  
  pCVar1 = work->problem->data;
  pCVar2 = work->iterates;
  local_40 = lambda;
  if (0 < work->settings->nLogLevel) {
    puts("Power Method:");
  }
  local_48 = work->buffer->data;
  cupdlp_initvec(local_48,1.0,pCVar1->nRows);
  res_00 = local_40;
  iVar3 = work->timers->nIter % 2;
  ax = pCVar2->ax[iVar3];
  aty = pCVar2->aty[iVar3];
  res = 0.0;
  for (uVar4 = 0; uVar4 != 0x14; uVar4 = uVar4 + 1) {
    ATy(work,aty,work->buffer);
    Ax(work,ax,aty);
    x = local_48;
    memcpy(local_48,ax->data,(long)pCVar1->nRows << 3);
    qNorm = 0.0;
    cupdlp_twoNorm(work,pCVar1->nRows,x,&qNorm);
    cupdlp_scaleVector(work,1.0 / qNorm,x,pCVar1->nRows);
    ATy(work,aty,work->buffer);
    cupdlp_twoNormSquared(work,pCVar1->nCols,aty->data,res_00);
    alpha = -*res_00;
    cupdlp_axpy(work,pCVar1->nRows,&alpha,x,ax->data);
    cupdlp_twoNormSquared(work,pCVar1->nCols,ax->data,&res);
    if (0 < work->settings->nLogLevel) {
      printf("% d  %e  %.3f\n",*res_00,res,(ulong)uVar4);
    }
  }
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Power_Method(CUPDLPwork *work, cupdlp_float *lambda) {
  cupdlp_retcode retcode = RETCODE_OK;
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPiterates *iterates = work->iterates;

  if (work->settings->nLogLevel>0) 
    cupdlp_printf("Power Method:\n");

  cupdlp_float *q = work->buffer->data;

  cupdlp_initvec(q, 1.0, lp->nRows);

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  double res = 0.0;
  for (cupdlp_int iter = 0; iter < 20; ++iter) {
    // z = A*A'*q
    ATy(work, aty, work->buffer);
    Ax(work, ax, aty);

    // q = z / norm(z)
    CUPDLP_COPY_VEC(q, ax->data, cupdlp_float, lp->nRows);
    cupdlp_float qNorm = 0.0;
    cupdlp_twoNorm(work, lp->nRows, q, &qNorm);
    cupdlp_scaleVector(work, 1.0 / qNorm, q, lp->nRows);

    ATy(work, aty, work->buffer);

    cupdlp_twoNormSquared(work, lp->nCols, aty->data, lambda);

    cupdlp_float alpha = -(*lambda);
    cupdlp_axpy(work, lp->nRows, &alpha, q, ax->data);

    cupdlp_twoNormSquared(work, lp->nCols, ax->data, &res);

     if (work->settings->nLogLevel>0) 
      cupdlp_printf("% d  %e  %.3f\n", iter, *lambda, res);
  }

exit_cleanup:
  return retcode;
}